

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteTrigger(sqlite3 *db,Trigger *pTrigger)

{
  Trigger *pTrigger_local;
  sqlite3 *db_local;
  
  if (pTrigger != (Trigger *)0x0) {
    sqlite3DeleteTriggerStep(db,pTrigger->step_list);
    sqlite3DbFree(db,pTrigger->zName);
    sqlite3DbFree(db,pTrigger->table);
    sqlite3ExprDelete(db,pTrigger->pWhen);
    sqlite3IdListDelete(db,pTrigger->pColumns);
    sqlite3DbFree(db,pTrigger);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTrigger(sqlite3 *db, Trigger *pTrigger){
  if( pTrigger==0 ) return;
  sqlite3DeleteTriggerStep(db, pTrigger->step_list);
  sqlite3DbFree(db, pTrigger->zName);
  sqlite3DbFree(db, pTrigger->table);
  sqlite3ExprDelete(db, pTrigger->pWhen);
  sqlite3IdListDelete(db, pTrigger->pColumns);
  sqlite3DbFree(db, pTrigger);
}